

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
GCSFilter::BuildHashedSet(GCSFilter *this,ElementSet *elements)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RSI;
  GCSFilter *in_RDI;
  long in_FS_OFFSET;
  Element *element;
  ElementSet *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *hashed_elements;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff68;
  unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  size_type in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current = (unsigned_long *)in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68);
  std::
  unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::size(in_stack_ffffffffffffff68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::
  unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::begin(in_stack_ffffffffffffff70);
  std::
  unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::end(in_stack_ffffffffffffff70);
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                             *)in_RDI,
                            (_Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                             *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_true>::
    operator*((_Node_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_true>
               *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 =
         (unordered_set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ByteVectorHash,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)HashToRange((GCSFilter *)__first._M_current,(Element *)in_RSI._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68,
               (value_type_conflict5 *)0x8c0a91);
    std::__detail::
    _Node_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_true>::
    operator++((_Node_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_true>
                *)in_stack_ffffffffffffff68);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff70);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (__first,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<uint64_t> GCSFilter::BuildHashedSet(const ElementSet& elements) const
{
    std::vector<uint64_t> hashed_elements;
    hashed_elements.reserve(elements.size());
    for (const Element& element : elements) {
        hashed_elements.push_back(HashToRange(element));
    }
    std::sort(hashed_elements.begin(), hashed_elements.end());
    return hashed_elements;
}